

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_cswap(fe *f,fe *g,fe_limb_t b)

{
  ulong uVar1;
  fe_limb_t x;
  uint i;
  fe_limb_t b_local;
  fe *g_local;
  fe *f_local;
  
  for (x._4_4_ = 0; x._4_4_ < 5; x._4_4_ = x._4_4_ + 1) {
    uVar1 = -b & (f->v[x._4_4_] ^ g->v[x._4_4_]);
    f->v[x._4_4_] = uVar1 ^ f->v[x._4_4_];
    g->v[x._4_4_] = uVar1 ^ g->v[x._4_4_];
  }
  return;
}

Assistant:

static void fe_cswap(fe *f, fe *g, fe_limb_t b) {
  b = 0 - b;
  for (unsigned i = 0; i < FE_NUM_LIMBS; i++) {
    fe_limb_t x = f->v[i] ^ g->v[i];
    x &= b;
    f->v[i] ^= x;
    g->v[i] ^= x;
  }
}